

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_buffer.hpp
# Opt level: O3

void __thiscall duckdb::DictionaryBuffer::~DictionaryBuffer(DictionaryBuffer *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var2;
  
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__DictionaryBuffer_0244ec68;
  pcVar1 = (this->dictionary_id)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->dictionary_id).field_2) {
    operator_delete(pcVar1);
  }
  this_00 = (this->sel_vector).selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__VectorBuffer_0244e900;
  AllocatedData::~AllocatedData(&(this->super_VectorBuffer).data);
  _Var2._M_head_impl =
       (this->super_VectorBuffer).aux_data.
       super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (VectorAuxiliaryData *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_VectorAuxiliaryData + 8))();
  }
  (this->super_VectorBuffer).aux_data.
  super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
  .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl =
       (VectorAuxiliaryData *)0x0;
  return;
}

Assistant:

explicit DictionaryBuffer(const SelectionVector &sel)
	    : VectorBuffer(VectorBufferType::DICTIONARY_BUFFER), sel_vector(sel) {
	}